

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Nrom_is_cpu_address_in_range_Test::TestBody
          (Nrom_is_cpu_address_in_range_Test *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  pointer pIVar4;
  char *pcVar5;
  Mapper in_R8D;
  char *in_R9;
  string local_3c8;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> rom;
  stringstream local_1b8 [8];
  stringstream ss;
  undefined1 local_30 [8];
  string bytes;
  Nrom_is_cpu_address_in_range_Test *this_local;
  
  bytes.field_2._8_8_ = this;
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            ((string *)local_30,(_anonymous_namespace_ *)0x1,'\x01','\0',in_R8D);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_30,_Var2);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&gtest_ar_.message_,(istream *)local_1b8);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar_.message_);
  iVar3 = (*pIVar4->_vptr_IRom[2])(pIVar4,0x6000);
  local_1e1 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1e0,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x6000u)","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar_.message_);
  iVar3 = (*pIVar4->_vptr_IRom[2])(pIVar4,0x7fff);
  local_229 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_228,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x7FFFu)","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar_.message_);
  iVar3 = (*pIVar4->_vptr_IRom[2])(pIVar4,0x8000);
  local_271 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_270,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x8000u)","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar_.message_);
  iVar3 = (*pIVar4->_vptr_IRom[2])(pIVar4,0xc000);
  local_2b9 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_2b8,
               (AssertionResult *)"rom->is_cpu_address_in_range(0xC000u)","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar_.message_);
  iVar3 = (*pIVar4->_vptr_IRom[2])(pIVar4,0xffff);
  local_301 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,&local_301,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_300,
               (AssertionResult *)"rom->is_cpu_address_in_range(0xFFFFu)","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar_.message_);
  iVar3 = (*pIVar4->_vptr_IRom[2])(pIVar4,0);
  local_349 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_348,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x0000u)","true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x91,pcVar5);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar_.message_);
  iVar3 = (*pIVar4->_vptr_IRom[2])(pIVar4,0x5fff);
  local_391 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3c8,(internal *)local_390,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x5FFFu)","true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x92,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar_.message_);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Nrom, is_cpu_address_in_range) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    EXPECT_TRUE(rom->is_cpu_address_in_range(0x6000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0x7FFFu));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0x8000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xC000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xFFFFu));

    EXPECT_FALSE(rom->is_cpu_address_in_range(0x0000u));
    EXPECT_FALSE(rom->is_cpu_address_in_range(0x5FFFu));
}